

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.h
# Opt level: O0

void propagate_carry_bwd(uchar *buf,uint32_t offs)

{
  byte bVar1;
  uint16_t carry;
  uint16_t sum;
  uint32_t offs_local;
  uchar *buf_local;
  
  offs_local = offs;
  do {
    bVar1 = buf[offs_local];
    buf[offs_local] = (uchar)(bVar1 + 1);
    offs_local = offs_local - 1;
  } while ((ushort)(bVar1 + 1) >> 8 != 0);
  return;
}

Assistant:

static inline void propagate_carry_bwd(unsigned char *buf, uint32_t offs) {
  uint16_t sum, carry = 1;
  do {
    sum = (uint16_t)buf[offs] + 1;
    buf[offs--] = (unsigned char)sum;
    carry = sum >> 8;
  } while (carry);
}